

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O1

bool __thiscall
cmGeneratorTarget::HasMacOSXRpathInstallNameDir(cmGeneratorTarget *this,string *config)

{
  cmMakefile *this_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  ImportInfo *pIVar4;
  long lVar5;
  size_t sVar6;
  cmake *this_01;
  cmListFileBacktrace *r;
  char *pcVar7;
  bool bVar8;
  string install_name;
  string local_200;
  cmListFileBacktrace local_1e0;
  long *local_1c0 [2];
  long local_1b0 [2];
  undefined1 local_1a0 [112];
  ios_base local_130 [264];
  
  if (this->Target->IsImportedTarget == false) {
    if (this->Target->TargetTypeValue != SHARED_LIBRARY) {
      return false;
    }
    local_1a0._0_8_ = local_1a0 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_1a0,"INSTALL_NAME_DIR","");
    pcVar7 = GetProperty(this,(string *)local_1a0);
    if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
      operator_delete((void *)local_1a0._0_8_,CONCAT71(local_1a0._17_7_,local_1a0[0x10]) + 1);
    }
    bVar2 = MacOSXUseInstallNameDir(this);
    if (pcVar7 == (char *)0x0 || !bVar2) {
      bVar8 = false;
    }
    else {
      local_1c0[0] = local_1b0;
      sVar6 = strlen(pcVar7);
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,pcVar7,pcVar7 + sVar6);
      iVar3 = std::__cxx11::string::compare((char *)local_1c0);
      bVar8 = iVar3 == 0;
      if (local_1c0[0] != local_1b0) {
        operator_delete(local_1c0[0],local_1b0[0] + 1);
      }
    }
    bVar2 = (bool)(!bVar2 | bVar8 | pcVar7 == (char *)0x0);
    if (bVar2 && !bVar8) {
      bVar1 = MacOSXRpathInstallNameDirDefault(this);
    }
    else {
      bVar1 = false;
    }
    if (!bVar2) {
      return false;
    }
  }
  else {
    pIVar4 = GetImportInfo(this,config);
    if (pIVar4 == (ImportInfo *)0x0) {
      bVar1 = false;
      bVar8 = false;
    }
    else if ((pIVar4->NoSOName == false) && ((pIVar4->SOName)._M_string_length != 0)) {
      bVar1 = false;
      lVar5 = std::__cxx11::string::find((char *)&pIVar4->SOName,0x583724,0);
      bVar8 = lVar5 == 0;
    }
    else {
      local_1a0._8_8_ = 0;
      local_1a0[0x10] = '\0';
      local_1a0._0_8_ = local_1a0 + 0x10;
      cmSystemTools::GuessLibraryInstallName(&pIVar4->Location,(string *)local_1a0);
      lVar5 = std::__cxx11::string::find(local_1a0,0x57ea23,0);
      bVar8 = lVar5 != -1;
      if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
        operator_delete((void *)local_1a0._0_8_,CONCAT71(local_1a0._17_7_,local_1a0[0x10]) + 1);
      }
      bVar1 = false;
    }
  }
  if ((!bVar8) && (bVar1 == false)) {
    return false;
  }
  this_00 = this->Makefile;
  local_1a0._0_8_ = local_1a0 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1a0,"CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG","");
  bVar2 = cmMakefile::IsSet(this_00,(string *)local_1a0);
  if ((undefined1 *)local_1a0._0_8_ != local_1a0 + 0x10) {
    operator_delete((void *)local_1a0._0_8_,CONCAT71(local_1a0._17_7_,local_1a0[0x10]) + 1);
  }
  if (!bVar2) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"Attempting to use ",0x12);
    pcVar7 = "@rpath";
    if (bVar1 != false) {
      pcVar7 = "MACOSX_RPATH";
    }
    lVar5 = 6;
    if (bVar1 != false) {
      lVar5 = 0xc;
    }
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar7,lVar5);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0," without CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG being set.",0x37);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0,"  This could be because you are using a Mac OS X version",0x38)
    ;
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_1a0," less than 10.5 or because CMake\'s platform configuration is",
               0x3c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0," corrupt.",9);
    this_01 = cmLocalGenerator::GetCMakeInstance(this->LocalGenerator);
    std::__cxx11::stringbuf::str();
    r = cmTarget::GetBacktrace(this->Target);
    cmListFileBacktrace::cmListFileBacktrace(&local_1e0,r);
    cmake::IssueMessage(this_01,FATAL_ERROR,&local_200,&local_1e0);
    cmListFileBacktrace::~cmListFileBacktrace(&local_1e0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_200._M_dataplus._M_p != &local_200.field_2) {
      operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
    std::ios_base::~ios_base(local_130);
    return true;
  }
  return true;
}

Assistant:

bool cmGeneratorTarget::HasMacOSXRpathInstallNameDir(
  const std::string& config) const
{
  bool install_name_is_rpath = false;
  bool macosx_rpath = false;

  if (!this->IsImported()) {
    if (this->GetType() != cmStateEnums::SHARED_LIBRARY) {
      return false;
    }
    const char* install_name = this->GetProperty("INSTALL_NAME_DIR");
    bool use_install_name = this->MacOSXUseInstallNameDir();
    if (install_name && use_install_name &&
        std::string(install_name) == "@rpath") {
      install_name_is_rpath = true;
    } else if (install_name && use_install_name) {
      return false;
    }
    if (!install_name_is_rpath) {
      macosx_rpath = this->MacOSXRpathInstallNameDirDefault();
    }
  } else {
    // Lookup the imported soname.
    if (cmGeneratorTarget::ImportInfo const* info =
          this->GetImportInfo(config)) {
      if (!info->NoSOName && !info->SOName.empty()) {
        if (info->SOName.find("@rpath/") == 0) {
          install_name_is_rpath = true;
        }
      } else {
        std::string install_name;
        cmSystemTools::GuessLibraryInstallName(info->Location, install_name);
        if (install_name.find("@rpath") != std::string::npos) {
          install_name_is_rpath = true;
        }
      }
    }
  }

  if (!install_name_is_rpath && !macosx_rpath) {
    return false;
  }

  if (!this->Makefile->IsSet("CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG")) {
    std::ostringstream w;
    w << "Attempting to use ";
    if (macosx_rpath) {
      w << "MACOSX_RPATH";
    } else {
      w << "@rpath";
    }
    w << " without CMAKE_SHARED_LIBRARY_RUNTIME_C_FLAG being set.";
    w << "  This could be because you are using a Mac OS X version";
    w << " less than 10.5 or because CMake's platform configuration is";
    w << " corrupt.";
    cmake* cm = this->LocalGenerator->GetCMakeInstance();
    cm->IssueMessage(cmake::FATAL_ERROR, w.str(), this->GetBacktrace());
  }

  return true;
}